

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::solver_inequalities_Zcoeff
          (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *this_00;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer pmVar3;
  pointer pfVar4;
  byte bVar5;
  bool bVar6;
  container_type *pcVar7;
  ulong uVar8;
  subsolver_type sVar9;
  longdouble *plVar10;
  int *__s;
  rc_data *__s_00;
  subsolver_type *psVar11;
  bound_factor *__s_01;
  undefined8 extraout_RAX;
  int bk_min;
  uint uVar12;
  undefined8 *puVar13;
  int iVar14;
  long lVar15;
  int bk_max;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar16;
  pointer pfVar17;
  uint *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  string_view name;
  string_view fmt;
  size_t local_z_variables_max;
  unsigned_long local_70;
  exhaustive_solver<baryonyx::itm::minimize_tag,_long_double> *local_68;
  ulong local_60;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_58;
  int local_4c;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  *local_48;
  size_t local_40;
  sparse_matrix<int> *local_38;
  
  name._M_str = "solver_inequalities_Zcoeff";
  name._M_len = 0x1a;
  pvVar16 = csts;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  local_58 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar19 = (ulong)(this->ap).m_rows_values.m_length;
  local_60 = CONCAT44(local_60._4_4_,n_);
  uVar21 = uVar19 << 4;
  local_38 = &this->ap;
  plVar10 = (longdouble *)operator_new__(uVar21);
  memset(plVar10,0,uVar21);
  uVar19 = uVar19 << 2;
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar10;
  __s = (int *)operator_new__(uVar19);
  memset(__s,0,uVar19);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  pmVar3 = (local_58->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(local_58->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  uVar19 = (long)*(pointer *)
                  ((long)&(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar3->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar15 != 0x28) {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar30 = vpbroadcastq_avx512f();
    uVar19 = 0;
    auVar31 = vpbroadcastq_avx512f();
    do {
      auVar32 = vpbroadcastq_avx512f();
      auVar33 = vmovdqa64_avx512f(auVar30);
      vpmullq_avx512dq(auVar26,auVar28);
      uVar19 = uVar19 + 8;
      auVar26 = vpaddq_avx512f(auVar26,auVar29);
      auVar30 = vporq_avx512f(auVar32,auVar27);
      uVar21 = vpcmpuq_avx512f(auVar30,auVar31,2);
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar3->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar16));
      bVar5 = (byte)uVar21;
      auVar32._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar30._8_8_;
      auVar32._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar30._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar30._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar30._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar30._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar30._48_8_;
      auVar32._56_8_ = (uVar21 >> 7) * auVar30._56_8_;
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar16->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar3->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar34._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar30._8_8_;
      auVar34._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_;
      auVar34._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar30._16_8_;
      auVar34._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar30._24_8_;
      auVar34._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar30._32_8_;
      auVar34._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar30._40_8_;
      auVar34._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar30._48_8_;
      auVar34._56_8_ = (uVar21 >> 7) * auVar30._56_8_;
      auVar30 = vpsubq_avx512f(auVar32,auVar34);
      auVar30 = vpsraq_avx512f(auVar30,3);
      auVar30 = vpmaxuq_avx512f(auVar33,auVar30);
    } while (((lVar15 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar19);
    auVar26 = vmovdqa64_avx512f(auVar30);
    auVar27._0_8_ = (ulong)(bVar5 & 1) * auVar26._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar33._0_8_;
    bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar27._8_8_ = (ulong)bVar6 * auVar26._8_8_ | (ulong)!bVar6 * auVar33._8_8_;
    bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar27._16_8_ = (ulong)bVar6 * auVar26._16_8_ | (ulong)!bVar6 * auVar33._16_8_;
    bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar27._24_8_ = (ulong)bVar6 * auVar26._24_8_ | (ulong)!bVar6 * auVar33._24_8_;
    bVar6 = (bool)((byte)(uVar21 >> 4) & 1);
    auVar27._32_8_ = (ulong)bVar6 * auVar26._32_8_ | (ulong)!bVar6 * auVar33._32_8_;
    bVar6 = (bool)((byte)(uVar21 >> 5) & 1);
    auVar27._40_8_ = (ulong)bVar6 * auVar26._40_8_ | (ulong)!bVar6 * auVar33._40_8_;
    bVar6 = (bool)((byte)(uVar21 >> 6) & 1);
    auVar27._48_8_ = (ulong)bVar6 * auVar26._48_8_ | (ulong)!bVar6 * auVar33._48_8_;
    auVar27._56_8_ = (uVar21 >> 7) * auVar26._56_8_ | (ulong)!SUB81(uVar21 >> 7,0) * auVar33._56_8_;
    auVar25 = vextracti64x4_avx512f(auVar27,1);
    auVar26 = vpmaxuq_avx512f(auVar27,ZEXT3264(auVar25));
    auVar23 = vpmaxuq_avx512vl(auVar26._0_16_,auVar26._16_16_);
    auVar24 = vpshufd_avx(auVar23,0xee);
    auVar24 = vpmaxuq_avx512vl(auVar23,auVar24);
    uVar19 = auVar24._0_8_;
  }
  uVar19 = -(ulong)(uVar19 >> 0x3b != 0) | uVar19 << 5;
  __s_00 = (rc_data *)operator_new__(uVar19);
  memset(__s_00,0,uVar19);
  uVar21 = (ulong)m_;
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
  ._M_head_impl = __s_00;
  psVar11 = (subsolver_type *)operator_new__(uVar21);
  memset(psVar11,0,uVar21);
  (this->Z)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type_*,_false>
  ._M_head_impl = psVar11;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar21;
  uVar19 = SUB168(auVar24 * ZEXT816(0xc),0);
  if (SUB168(auVar24 * ZEXT816(0xc),8) != 0) {
    uVar19 = 0xffffffffffffffff;
  }
  __s_01 = (bound_factor *)operator_new__(uVar19);
  memset(__s_01,0,uVar19);
  uVar21 = uVar21 << 4;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_false>
  ._M_head_impl = __s_01;
  if (m_ < 0) {
    uVar21 = 0xffffffffffffffff;
  }
  plVar10 = (longdouble *)operator_new__(uVar21);
  iVar22 = 0;
  memset(plVar10,0,uVar21);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar10;
  local_68 = &this->ex;
  this_00 = &this->bb;
  pcVar7 = &(this->bb).subvector.m_container;
  (pcVar7->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar7->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = (undefined1  [16])0x0;
  (this->bb).subvector.m_free_list_head = 0xffffffff;
  p_Var1 = &(this->ex).constraints._M_t._M_impl.super__Rb_tree_header;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).items.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  (this->ex).items =
       (vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
        )auVar26._0_24_;
  (this->ex).flat_constraints = (vector<int,_std::allocator<int>_>)auVar26._24_24_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._48_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar26._56_8_;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->c = c_;
  this->m = m_;
  uVar19 = 0;
  this->n = (int)local_60;
  uVar21 = ((long)(local_58->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_58->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if ((int)uVar21 != 0) {
    local_60 = uVar21 & 0xffffffff;
    uVar21 = 0;
    uVar19 = 0;
    local_40 = 0;
    local_48 = this;
    do {
      local_70 = 0;
      psVar11 = (this->Z)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type_*,_false>
                ._M_head_impl;
      psVar11[uVar21] = linear;
      pmVar3 = (local_58->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar17 = *(pointer *)
                 &pmVar3[uVar21].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar4 = *(pointer *)
                ((long)&pmVar3[uVar21].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar17 == pfVar4) {
        sVar9 = linear;
        iVar14 = 0;
        bk_max = 0;
      }
      else {
        sVar9 = linear;
        iVar14 = 0;
        bk_max = 0;
        puVar18 = (uint *)((this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                           _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl + iVar22);
        uVar8 = 1;
        do {
          uVar20 = uVar8;
          uVar2 = pfVar17->factor;
          puVar13 = (undefined8 *)(ulong)uVar2;
          if (uVar2 == 0) {
            itm::solver_inequalities_Zcoeff();
            goto LAB_0060444e;
          }
          *puVar18 = uVar2;
          uVar2 = pfVar17->factor;
          uVar12 = 0;
          if ((int)uVar2 < 0) {
            uVar12 = uVar2;
          }
          if (uVar2 - 2 < 0xfffffffd) {
            sVar9 = branch_and_bound;
            psVar11[uVar21] = branch_and_bound;
          }
          iVar14 = iVar14 + uVar12;
          pfVar17 = pfVar17 + 1;
          puVar18 = puVar18 + 1;
          iVar22 = iVar22 + 1;
          bk_max = bk_max + (~((int)uVar2 >> 0x1f) & uVar2);
          uVar8 = uVar20 + 1;
          local_70 = uVar20;
        } while (pfVar17 != pfVar4);
        this = local_48;
        if (sVar9 == branch_and_bound && uVar20 < 10) {
          sVar9 = exhaustive;
          psVar11[uVar21] = exhaustive;
        }
      }
      pmVar3 = pmVar3 + uVar21;
      bk_min = pmVar3->min;
      if (bk_min == pmVar3->max) {
        __s_01[uVar21].min = bk_min;
        bk_max = bk_min;
      }
      else {
        if ((bk_min <= iVar14) || (bk_max <= pmVar3->max)) {
          if (sVar9 == branch_and_bound) {
            sVar9 = unconstrained_branch_and_bound;
          }
          else {
            if (sVar9 != exhaustive) goto LAB_00604333;
            sVar9 = unconstrained_exhaustive;
          }
          psVar11[uVar21] = sVar9;
        }
LAB_00604333:
        if (bk_min < iVar14) {
          bk_min = iVar14;
        }
        __s_01[uVar21].min = bk_min;
        if (pmVar3->max < bk_max) {
          bk_max = pmVar3->max;
        }
      }
      if (uVar19 <= local_70) {
        uVar19 = local_70;
      }
      __s_01[uVar21].max = bk_max;
      if ((sVar9 | unconstrained_branch_and_bound) == unconstrained_exhaustive) {
        exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
        build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                  ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)local_68,
                   (int)uVar21,&pmVar3->elements,bk_min,bk_max);
        local_40 = local_40 + 1;
        __s_01 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_false>
                 ._M_head_impl;
        sVar9 = (this->Z)._M_t.
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::subsolver_type_*,_false>
                ._M_head_impl[uVar21];
      }
      local_4c = (int)(char)sVar9;
      puVar13 = (undefined8 *)(uVar21 * 0xc);
      fmt._M_str = "Is Z: {} ({}) with {} <= {}\n";
      fmt._M_len = 0x1c;
      debug_logger<true>::log<int,unsigned_long,int,int>
                (&this->super_debug_logger<true>,fmt,&local_4c,&local_70,&__s_01[uVar21].min,
                 &__s_01[uVar21].max);
      __s_01 = (this->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_false>
               ._M_head_impl;
      if (__s_01[uVar21].max < __s_01[uVar21].min) {
LAB_0060444e:
        itm::solver_inequalities_Zcoeff();
        operator_delete__(__s_01);
        puVar13[0xe] = 0;
        if ((void *)puVar13[0xd] != (void *)0x0) {
          operator_delete__((void *)puVar13[0xd]);
        }
        puVar13[0xd] = 0;
        if ((void *)puVar13[0xc] != (void *)0x0) {
          operator_delete__((void *)puVar13[0xc]);
        }
        puVar13[0xc] = 0;
        if ((void *)puVar13[0xb] != (void *)0x0) {
          operator_delete__((void *)puVar13[0xb]);
        }
        puVar13[0xb] = 0;
        if ((void *)puVar13[10] != (void *)0x0) {
          operator_delete__((void *)puVar13[10]);
        }
        puVar13[10] = 0;
        sparse_matrix<int>::~sparse_matrix(local_38);
        if ((FILE *)*puVar13 != (FILE *)0x0) {
          fclose((FILE *)*puVar13);
        }
        _Unwind_Resume(extraout_RAX);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != local_60);
    if (local_40 != 0) {
      exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::reserve(local_68,uVar19,local_40)
      ;
    }
  }
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
  ::reserve(&(this->bb).items,uVar19);
  std::vector<signed_char,_std::allocator<signed_char>_>::reserve
            ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,uVar19 << 10);
  return;
}

Assistant:

solver_inequalities_Zcoeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_Zcoeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , Z(std::make_unique<subsolver_type[]>(m_))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        // Count the maximum function elements in the constraint where a least
        // one coefficient is in Z. To be use with the branch-and-bound and
        // exhaustive solvers.
        std::size_t z_variables_max = 0;

        // Count the maximum constraint number where at leat one coefficient is
        // in Z. To be used with the exhaustive solver.
        std::size_t z_constraint_exhaustive = 0;

        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;
            std::size_t local_z_variables_max = 0;

            Z[i] =
              subsolver_type::linear; // Default, Z solver use the classical
                                      // Bastert selection for 101 problem.

            for (const auto& cst : csts[i].elements) {
                bx_ensures(cst.factor);
                A[id++] = cst.factor;
                ++local_z_variables_max;

                if (cst.factor > 0)
                    upper += cst.factor;
                else
                    lower += cst.factor;

                if (cst.factor < -1 || cst.factor > 1) {
                    Z[i] = subsolver_type::branch_and_bound;
                }
            }

            if (Z[i] == subsolver_type::branch_and_bound &&
                local_z_variables_max < maximum_factor_exhaustive_solver)
                Z[i] = subsolver_type::exhaustive;

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                if (lower >= csts[i].min || upper <= csts[i].max) {
                    if (Z[i] == subsolver_type::branch_and_bound)
                        Z[i] = subsolver_type::unconstrained_branch_and_bound;
                    else if (Z[i] == subsolver_type::exhaustive)
                        Z[i] = subsolver_type::unconstrained_exhaustive;
                }

                b[i].min = std::max(lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            z_variables_max = std::max(z_variables_max, local_z_variables_max);

            if (Z[i] == subsolver_type::exhaustive ||
                Z[i] == subsolver_type::unconstrained_exhaustive) {
                z_constraint_exhaustive++;
                ex.build_constraints(i, csts[i].elements, b[i].min, b[i].max);
            }

            logger::log("Is Z: {} ({}) with {} <= {}\n",
                        static_cast<int>(Z[i]),
                        local_z_variables_max,
                        b[i].min,
                        b[i].max);

            bx_ensures(b[i].min <= b[i].max);
        }

        if (z_constraint_exhaustive > 0)
            ex.reserve(z_variables_max, z_constraint_exhaustive);

        bb.reserve(z_variables_max);
    }